

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::
PhysicalStorageBufferPointerHandler(PhysicalStorageBufferPointerHandler *this,Compiler *compiler_)

{
  (this->super_OpcodeHandler)._vptr_OpcodeHandler =
       (_func_int **)&PTR__PhysicalStorageBufferPointerHandler_00ac2fb8;
  this->compiler = compiler_;
  (this->non_block_types)._M_h._M_buckets = &(this->non_block_types)._M_h._M_single_bucket;
  (this->non_block_types)._M_h._M_bucket_count = 1;
  (this->non_block_types)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->non_block_types)._M_h._M_element_count = 0;
  (this->non_block_types)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->non_block_types)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->non_block_types)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->physical_block_type_meta)._M_h._M_buckets =
       &(this->physical_block_type_meta)._M_h._M_single_bucket;
  (this->physical_block_type_meta)._M_h._M_bucket_count = 1;
  (this->physical_block_type_meta)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->physical_block_type_meta)._M_h._M_element_count = 0;
  (this->physical_block_type_meta)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->physical_block_type_meta)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->physical_block_type_meta)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->access_chain_to_physical_block)._M_h._M_buckets =
       &(this->access_chain_to_physical_block)._M_h._M_single_bucket;
  (this->access_chain_to_physical_block)._M_h._M_bucket_count = 1;
  (this->access_chain_to_physical_block)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->access_chain_to_physical_block)._M_h._M_element_count = 0;
  (this->access_chain_to_physical_block)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->access_chain_to_physical_block)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->access_chain_to_physical_block)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Compiler::PhysicalStorageBufferPointerHandler::PhysicalStorageBufferPointerHandler(Compiler &compiler_)
    : compiler(compiler_)
{
}